

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

StringRef __thiscall
Catch::anon_unknown_26::extractFilenamePart(anon_unknown_26 *this,StringRef filename)

{
  char *pcVar1;
  anon_unknown_26 *paVar2;
  char *pcVar3;
  ulong uVar4;
  size_t lastDot;
  char *pcVar5;
  ulong uVar6;
  StringRef SVar7;
  
  pcVar5 = filename.m_start;
  uVar4 = 0;
  pcVar3 = pcVar5;
  do {
    pcVar1 = pcVar3;
    pcVar3 = pcVar1 + -1;
    paVar2 = (anon_unknown_26 *)0x180e41;
    if (pcVar1 == (char *)0x0) goto LAB_00140d02;
  } while ((this + -1)[(long)pcVar1] != (anon_unknown_26)0x2e);
  while (pcVar1 != (char *)0x1) {
    paVar2 = this + -2 + (long)pcVar1;
    pcVar1 = pcVar1 + -1;
    if ((*paVar2 == (anon_unknown_26)0x5c) || (*paVar2 == (anon_unknown_26)0x2f)) goto LAB_00140cd8;
  }
  pcVar1 = (char *)0x0;
LAB_00140cd8:
  uVar4 = (long)pcVar3 - (long)pcVar1;
  uVar6 = (long)pcVar5 - (long)pcVar1;
  if (uVar4 <= (ulong)((long)pcVar5 - (long)pcVar1)) {
    uVar6 = uVar4;
  }
  uVar4 = 0;
  if (pcVar1 < pcVar5) {
    uVar4 = uVar6;
  }
  paVar2 = (anon_unknown_26 *)0x180e41;
  if (pcVar1 < pcVar5) {
    paVar2 = this + (long)pcVar1;
  }
LAB_00140d02:
  SVar7.m_size = uVar4;
  SVar7.m_start = (char *)paVar2;
  return SVar7;
}

Assistant:

StringRef extractFilenamePart(StringRef filename) {
            size_t lastDot = filename.size();
            while (lastDot > 0 && filename[lastDot - 1] != '.') {
                --lastDot;
            }
            // In theory we could have filename without any extension in it
            if ( lastDot == 0 ) { return StringRef(); }

            --lastDot;
            size_t nameStart = lastDot;
            while (nameStart > 0 && filename[nameStart - 1] != '/' && filename[nameStart - 1] != '\\') {
                --nameStart;
            }

            return filename.substr(nameStart, lastDot - nameStart);
        }